

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  Table *pTab;
  Db *pDVar2;
  Schema *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vdbe *p;
  KeyInfo *zP4;
  Parse *pPVar8;
  byte bVar9;
  Op *pOVar10;
  Schema **ppSVar11;
  int iVar12;
  int iVar13;
  int local_68;
  int local_64;
  int iPartIdxLabel;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  pDVar2 = pParse->db->aDb;
  if (pIndex->pSchema == (Schema *)0x0) {
    iVar13 = -1000000;
  }
  else {
    iVar13 = -1;
    ppSVar11 = &pDVar2->pSchema;
    do {
      iVar13 = iVar13 + 1;
      pSVar3 = *ppSVar11;
      ppSVar11 = ppSVar11 + 4;
    } while (pSVar3 != pIndex->pSchema);
  }
  iVar4 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,pDVar2[iVar13].zDbSName);
  if (iVar4 == 0) {
    sqlite3TableLock(pParse,iVar13,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      local_64 = memRootPage;
      if (memRootPage < 0) {
        local_64 = pIndex->tnum;
      }
      zP4 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar4 = pParse->nTab;
      pParse->nTab = iVar4 + 1;
      uVar1 = pIndex->nKeyCol;
      if (zP4 != (KeyInfo *)0x0) {
        zP4->nRef = zP4->nRef + 1;
      }
      iVar5 = sqlite3VdbeAddOp3(p,0x72,iVar4,0,(uint)uVar1);
      sqlite3VdbeChangeP4(p,iVar5,(char *)zP4,-9);
      sqlite3OpenTable(pParse,iCur,iVar13,pTab,0x6c);
      iVar5 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
      if (pParse->nTempReg == '\0') {
        iVar12 = pParse->nMem + 1;
        pParse->nMem = iVar12;
      }
      else {
        bVar9 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar9;
        iVar12 = pParse->aTempReg[bVar9];
      }
      pPVar8 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar8 = pParse;
      }
      pPVar8->isMultiWrite = '\x01';
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,iVar12,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp3(p,0x83,iVar4,iVar12,0);
      if (iPartIdxLabel != 0) {
        sqlite3VdbeResolveLabel(pParse->pVdbe,iPartIdxLabel);
      }
      sqlite3VdbeAddOp3(p,5,iCur,iVar5 + 1,0);
      if (p->db->mallocFailed == '\0') {
        iVar6 = p->nOp + -1;
        if (-1 < iVar5) {
          iVar6 = iVar5;
        }
        pOVar10 = p->aOp + iVar6;
      }
      else {
        pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      iVar5 = iCur + 1;
      pOVar10->p2 = p->nOp;
      if (memRootPage < 0) {
        sqlite3VdbeAddOp3(p,0x89,local_64,iVar13,0);
      }
      iVar13 = sqlite3VdbeAddOp3(p,0x6d,iVar5,local_64,iVar13);
      sqlite3VdbeChangeP4(p,iVar13,(char *)zP4,-9);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar13 = sqlite3VdbeAddOp3(p,0x22,iVar4,0,0);
      if (pIndex->onError == '\0') {
        local_68 = p->nOp;
      }
      else {
        iVar6 = sqlite3VdbeAddOp3(p,0xb,0,1,0);
        local_68 = p->nOp;
        uVar1 = pIndex->nKeyCol;
        iVar7 = sqlite3VdbeAddOp3(p,0x7d,iVar4,iVar6,iVar12);
        if (p->db->mallocFailed == '\0') {
          pOVar10 = p->aOp;
          pOVar10[iVar7].p4type = -3;
          *(uint *)&pOVar10[iVar7].p4 = (uint)uVar1;
        }
        sqlite3UniqueConstraint(pParse,2,pIndex);
        if (p->db->mallocFailed == '\0') {
          iVar7 = p->nOp + -1;
          if (-1 < iVar6) {
            iVar7 = iVar6;
          }
          pOVar10 = p->aOp + iVar7;
        }
        else {
          pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar10->p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x7e,iVar4,iVar12,iVar5);
      sqlite3VdbeAddOp3(p,0x82,iVar5,0,0);
      sqlite3VdbeAddOp3(p,0x84,iVar5,iVar12,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (iVar12 != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = iVar12;
        }
      }
      sqlite3VdbeAddOp3(p,3,iVar4,local_68,0);
      if (p->db->mallocFailed == '\0') {
        iVar12 = p->nOp + -1;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        pOVar10 = p->aOp + iVar12;
      }
      else {
        pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar10->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
      sqlite3VdbeAddOp3(p,0x75,iVar5,0,0);
      sqlite3VdbeAddOp3(p,0x75,iVar4,0,0);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}